

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample-sort.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer *pppLVar1;
  pointer *ppiVar2;
  pointer *ppbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *__s;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char **ppcVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  _List_node_base *p_Var12;
  size_t sVar13;
  QueuePolicy *q_policy;
  time_t tVar14;
  Block<float> *this;
  void *pvVar15;
  Link *pLVar16;
  ostream *poVar17;
  long *plVar18;
  int iVar19;
  int iVar20;
  _Rb_tree_color _Var21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  _Rb_tree_node_base *p_Var28;
  size_t *psVar29;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  bool verify;
  bool print;
  int nblocks;
  bool help;
  bool verbose;
  int chunk_size;
  vector<int,_std::allocator<int>_> gids;
  int num_samples;
  _List_node_base *local_1b88;
  _List_node_base *local_1b80;
  _List_node_base *local_1b78;
  _List_node_base *local_1b70;
  _List_node_base *local_1b68;
  _List_node_base *local_1b60;
  _List_node_base *local_1b58;
  _List_node_base *local_1b50;
  _List_node_base *local_1b48;
  _List_node_base *local_1b40;
  _List_node_base *local_1b38;
  _List_node_base *local_1b30;
  _List_node_base *local_1b28;
  _List_node_base *local_1b20;
  string infile;
  vector<int,_std::allocator<int>_> shape;
  file in;
  Value max;
  Value min;
  int threads;
  int mem_blocks;
  int k;
  communicator world;
  MPI_Offset sz;
  undefined8 uStack_1a80;
  undefined1 local_1a78 [16];
  type local_1a68 [2];
  _Base_ptr local_1a60;
  type *local_1a58;
  type *local_1a50;
  size_t local_1a48;
  int *local_1a40;
  int *local_1a38;
  _Base_ptr local_1a30;
  _Rb_tree_node_base *local_1a28;
  _Rb_tree_node_base *local_1a20;
  size_t local_1a18;
  list<diy::Master::Collective,_std::allocator<diy::Master::Collective>_> *local_1a10;
  cothread_t pvStack_1a08;
  bool local_1a00;
  void *local_19f8;
  Link *local_19f0;
  char **local_19e0;
  size_t num_values;
  Options ops;
  ContiguousAssigner assigner;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1988;
  BOV reader;
  size_t local_1938 [2];
  _Rb_tree_node_base local_1928;
  size_t local_1908;
  list<diy::Master::Collective,_std::allocator<diy::Master::Collective>_> *local_1900;
  cothread_t pvStack_18f8;
  bool local_18f0;
  string local_18e8;
  string prefix;
  LoadBlock local_18a8;
  SaveBlock local_1888;
  DestroyBlock local_1868;
  CreateBlock local_1848;
  environment env;
  FileStorage storage;
  string local_17a0;
  string local_1780;
  string local_1760;
  string local_1740;
  string local_1720;
  string local_1700;
  communicator local_16e0;
  _Any_data local_16c8;
  code *local_16b8;
  code *local_16b0;
  _Any_data local_16a8;
  code *local_1698;
  code *local_1690;
  _Any_data local_1688;
  code *local_1678;
  code *local_1670;
  Master master;
  
  sz = CONCAT44(sz._4_4_,argc);
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)argv;
  MPI_Init_thread(&sz,&master,1);
  world.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  world.rank_ = 0;
  world.size_ = 1;
  world.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(world.comm_.data);
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  nblocks = world.size_;
  num_values = 100;
  k = 2;
  num_samples = 8;
  mem_blocks = -1;
  threads = 1;
  chunk_size = 1;
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)&prefix,"./DIY.XXXXXX","");
  pppLVar1 = &master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppLVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&master,"print","");
  sz = (MPI_Offset)local_1a78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sz,"print the result","");
  opts::Option<bool>((opts *)&local_1b20,(string *)&master,&print,(string *)&sz);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b20;
  local_1b20 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  ppiVar2 = &reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  reader.f_ = (file *)ppiVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&reader,"verbose","");
  ppbVar3 = &storage.filename_templates_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  storage.super_ExternalStorage._vptr_ExternalStorage = (_func_int **)ppbVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&storage,"verbose output","");
  opts::Option<bool>((opts *)&local_1b28,'v',(string *)&reader,&verbose,(string *)&storage);
  local_19e0 = argv;
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b28;
  local_1b28 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  paVar4 = &infile.field_2;
  infile._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&infile,"verify","");
  in.comm_.comm_.data = (MPI_Comm)&in.comm_.owner_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&in,"verify the result","");
  opts::Option<bool>((opts *)&local_1b30,&infile,&verify,(string *)&in);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b30;
  local_1b30 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gids,"help","");
  shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&shape,"show help","");
  opts::Option<bool>((opts *)&local_1b38,'h',(string *)&gids,&help,(string *)&shape);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b38;
  local_1b38 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  if (local_1b38 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b38 + 8))();
  }
  local_1b38 = (_List_node_base *)0x0;
  if ((pointer *)
      shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != &shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
    operator_delete(shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((pointer *)
      gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      &gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_1b30 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b30 + 8))();
  }
  local_1b30 = (_List_node_base *)0x0;
  if (in.comm_.comm_.data != (MPI_Comm)&in.comm_.owner_) {
    operator_delete(in.comm_.comm_.data,in.comm_._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)infile._M_dataplus._M_p != paVar4) {
    operator_delete(infile._M_dataplus._M_p,
                    CONCAT71(infile.field_2._M_allocated_capacity._1_7_,
                             infile.field_2._M_local_buf[0]) + 1);
  }
  if (local_1b28 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b28 + 8))();
  }
  local_1b28 = (_List_node_base *)0x0;
  if ((pointer *)storage.super_ExternalStorage._vptr_ExternalStorage != ppbVar3) {
    operator_delete(storage.super_ExternalStorage._vptr_ExternalStorage,
                    (ulong)((long)&((storage.filename_templates_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p
                           + 1));
  }
  if (reader.f_ != (file *)ppiVar2) {
    operator_delete(reader.f_,
                    (long)reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1);
  }
  if (local_1b20 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b20 + 8))();
  }
  local_1b20 = (_List_node_base *)0x0;
  if ((undefined1 *)sz != local_1a78) {
    operator_delete((void *)sz,(ulong)(local_1a78._0_8_ + 1));
  }
  if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppLVar1) {
    operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  min = 0.0;
  max = 1048576.0;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppLVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&master,"number","");
  sz = (MPI_Offset)local_1a78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sz,"number of values per block","");
  opts::Option<unsigned_long>((opts *)&local_1b40,'n',(string *)&master,&num_values,(string *)&sz);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b40;
  local_1b40 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  reader.f_ = (file *)ppiVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&reader,"k","");
  storage.super_ExternalStorage._vptr_ExternalStorage = (_func_int **)ppbVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&storage,"use k-ary swap","");
  opts::Option<int>((opts *)&local_1b48,'k',(string *)&reader,&k,(string *)&storage);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b48;
  local_1b48 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  infile._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&infile,"samples","");
  in.comm_.comm_.data = (MPI_Comm)&in.comm_.owner_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&in,"number of samples per block","");
  opts::Option<int>((opts *)&local_1b50,'s',&infile,&num_samples,(string *)&in);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b50;
  local_1b50 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gids,"blocks","");
  shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&shape,"number of blocks","");
  opts::Option<int>((opts *)&local_1b58,'b',(string *)&gids,&nblocks,(string *)&shape);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b58;
  local_1b58 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  assigner.super_StaticAssigner.super_Assigner._vptr_Assigner = (_func_int **)&local_1988;
  std::__cxx11::string::_M_construct<char_const*>((string *)&assigner,"thread","");
  local_18e8._M_dataplus._M_p = (pointer)&local_18e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_18e8,"number of threads","");
  opts::Option<int>((opts *)&local_1b60,'t',(string *)&assigner,&threads,&local_18e8);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b60;
  local_1b60 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_1700._M_dataplus._M_p = (pointer)&local_1700.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1700,"memory","");
  local_1720._M_dataplus._M_p = (pointer)&local_1720.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1720,"number of blocks to keep in memory","");
  opts::Option<int>((opts *)&local_1b68,'m',&local_1700,&mem_blocks,&local_1720);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b68;
  local_1b68 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_1740._M_dataplus._M_p = (pointer)&local_1740.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1740,"chunk","");
  local_1760._M_dataplus._M_p = (pointer)&local_1760.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1760,"size of a chunk in which to read the data","");
  opts::Option<int>((opts *)&local_1b70,'c',&local_1740,&chunk_size,&local_1760);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b70;
  local_1b70 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_1780._M_dataplus._M_p = (pointer)&local_1780.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1780,"prefix","");
  local_17a0._M_dataplus._M_p = (pointer)&local_17a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_17a0,"prefix for external storage","");
  opts::Option<std::__cxx11::string>((opts *)&local_1b78,&local_1780,&prefix,&local_17a0);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b78;
  local_1b78 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  if (local_1b78 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b78 + 8))();
  }
  local_1b78 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17a0._M_dataplus._M_p != &local_17a0.field_2) {
    operator_delete(local_17a0._M_dataplus._M_p,local_17a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1780._M_dataplus._M_p != &local_1780.field_2) {
    operator_delete(local_1780._M_dataplus._M_p,local_1780.field_2._M_allocated_capacity + 1);
  }
  if (local_1b70 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b70 + 8))();
  }
  local_1b70 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1760._M_dataplus._M_p != &local_1760.field_2) {
    operator_delete(local_1760._M_dataplus._M_p,local_1760.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1740._M_dataplus._M_p != &local_1740.field_2) {
    operator_delete(local_1740._M_dataplus._M_p,local_1740.field_2._M_allocated_capacity + 1);
  }
  if (local_1b68 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b68 + 8))();
  }
  local_1b68 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1720._M_dataplus._M_p != &local_1720.field_2) {
    operator_delete(local_1720._M_dataplus._M_p,local_1720.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &infile.field_2;
  pppLVar1 = &master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  ppiVar2 = &reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1700._M_dataplus._M_p != &local_1700.field_2) {
    operator_delete(local_1700._M_dataplus._M_p,local_1700.field_2._M_allocated_capacity + 1);
  }
  if (local_1b60 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b60 + 8))();
  }
  local_1b60 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18e8._M_dataplus._M_p != &local_18e8.field_2) {
    operator_delete(local_18e8._M_dataplus._M_p,local_18e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)assigner.super_StaticAssigner.super_Assigner._vptr_Assigner != &local_1988) {
    operator_delete(assigner.super_StaticAssigner.super_Assigner._vptr_Assigner,
                    local_1988._M_allocated_capacity + 1);
  }
  if (local_1b58 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b58 + 8))();
  }
  local_1b58 = (_List_node_base *)0x0;
  if ((pointer *)
      shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != &shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
    operator_delete(shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((pointer *)
      gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      &gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_1b50 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b50 + 8))();
  }
  local_1b50 = (_List_node_base *)0x0;
  if (in.comm_.comm_.data != (MPI_Comm)&in.comm_.owner_) {
    operator_delete(in.comm_.comm_.data,in.comm_._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)infile._M_dataplus._M_p != paVar4) {
    operator_delete(infile._M_dataplus._M_p,
                    CONCAT71(infile.field_2._M_allocated_capacity._1_7_,
                             infile.field_2._M_local_buf[0]) + 1);
  }
  if (local_1b48 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b48 + 8))();
  }
  local_1b48 = (_List_node_base *)0x0;
  if ((pointer *)storage.super_ExternalStorage._vptr_ExternalStorage !=
      &storage.filename_templates_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(storage.super_ExternalStorage._vptr_ExternalStorage,
                    (ulong)((long)&((storage.filename_templates_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p
                           + 1));
  }
  if (reader.f_ != (file *)ppiVar2) {
    operator_delete(reader.f_,
                    (long)reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1);
  }
  if (local_1b40 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b40 + 8))();
  }
  local_1b40 = (_List_node_base *)0x0;
  if ((undefined1 *)sz != local_1a78) {
    operator_delete((void *)sz,(ulong)(local_1a78._0_8_ + 1));
  }
  if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppLVar1) {
    operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppLVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&master,"min","");
  sz = (MPI_Offset)local_1a78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sz,"range min","");
  opts::Option<float>((opts *)&local_1b80,(string *)&master,&min,(string *)&sz);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b80;
  local_1b80 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  reader.f_ = (file *)ppiVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&reader,"max","");
  storage.super_ExternalStorage._vptr_ExternalStorage =
       (_func_int **)
       &storage.filename_templates_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)&storage,"range max","");
  opts::Option<float>((opts *)&local_1b88,(string *)&reader,&max,(string *)&storage);
  p_Var12 = (_List_node_base *)operator_new(0x18);
  p_Var12[1]._M_next = local_1b88;
  local_1b88 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var12);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  if (local_1b88 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b88 + 8))();
  }
  local_1b88 = (_List_node_base *)0x0;
  if ((pointer *)storage.super_ExternalStorage._vptr_ExternalStorage !=
      &storage.filename_templates_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(storage.super_ExternalStorage._vptr_ExternalStorage,
                    (ulong)((long)&((storage.filename_templates_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p
                           + 1));
  }
  if (reader.f_ != (file *)ppiVar2) {
    operator_delete(reader.f_,
                    (long)reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1);
  }
  if (local_1b80 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b80 + 8))();
  }
  local_1b80 = (_List_node_base *)0x0;
  if ((undefined1 *)sz != local_1a78) {
    operator_delete((void *)sz,(ulong)(local_1a78._0_8_ + 1));
  }
  if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppLVar1) {
    operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  ppcVar8 = local_19e0;
  bVar9 = opts::Options::parse(&ops,argc,local_19e0);
  if ((!bVar9) || (help == true)) {
    iVar11 = 1;
    if (world.rank_ == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
      __s = *ppcVar8;
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x150318);
      }
      else {
        sVar13 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar13);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," [OPTIONS] [INPUT.bov]\n",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Generates random values in range [min,max] if not INPUT.bov is given.\n",0x46);
      opts::operator<<((ostream *)&std::cout,&ops);
    }
    goto LAB_00109e9f;
  }
  infile._M_string_length = 0;
  infile.field_2._M_local_buf[0] = '\0';
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&infile;
  infile._M_dataplus._M_p = (pointer)paVar4;
  if (ops.failed == false) {
    bVar9 = opts::
            PosOptionContainer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::parse((PosOptionContainer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&master,&ops.args);
    ops.failed = !bVar9;
  }
  storage.super_ExternalStorage._vptr_ExternalStorage = (_func_int **)&PTR_put_0014e260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&storage.filename_templates_,1,&prefix,(allocator_type *)&master);
  iVar20 = mem_blocks;
  iVar11 = threads;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  storage.filenames_.m_.mLock = 0;
  storage.max_size_.x_ = 0;
  storage.max_size_.m_.mLock = 0;
  storage.count_.x_ = 0;
  storage.count_.m_.mLock = 0;
  storage.current_size_.x_ = 0;
  storage.current_size_.m_.mLock = 0;
  local_16e0.comm_.data = world.comm_.data;
  local_16e0.rank_ = world.rank_;
  local_16e0.size_ = world.size_;
  local_16e0.owner_ = false;
  local_1848.super__Function_base._M_functor._8_8_ = 0;
  local_1848.super__Function_base._M_functor._M_unused._M_object = Block<float>::create;
  local_1848._M_invoker = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
  local_1848.super__Function_base._M_manager =
       std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
  local_1868.super__Function_base._M_functor._8_8_ = 0;
  local_1868.super__Function_base._M_functor._M_unused._M_object = Block<float>::destroy;
  local_1868._M_invoker = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
  local_1868.super__Function_base._M_manager =
       std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
  local_1888.super__Function_base._M_functor._8_8_ = 0;
  local_1888.super__Function_base._M_functor._M_unused._M_object = Block<float>::save;
  local_1888._M_invoker =
       std::
       _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
       ::_M_invoke;
  local_1888.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
       ::_M_manager;
  local_18a8.super__Function_base._M_functor._8_8_ = 0;
  local_18a8.super__Function_base._M_functor._M_unused._M_object = Block<float>::load;
  local_18a8._M_invoker =
       std::
       _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
       ::_M_invoke;
  local_18a8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
       ::_M_manager;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  q_policy = (QueuePolicy *)operator_new(0x10);
  q_policy->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_0014e3c8;
  q_policy[1]._vptr_QueuePolicy = (_func_int **)0x1000;
  diy::Master::Master(&master,&local_16e0,iVar11,iVar20,&local_1848,&local_1868,
                      &storage.super_ExternalStorage,&local_1888,&local_18a8,q_policy);
  if (local_18a8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_18a8.super__Function_base._M_manager)
              ((_Any_data *)&local_18a8,(_Any_data *)&local_18a8,__destroy_functor);
  }
  if (local_1888.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1888.super__Function_base._M_manager)
              ((_Any_data *)&local_1888,(_Any_data *)&local_1888,__destroy_functor);
  }
  if (local_1868.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1868.super__Function_base._M_manager)
              ((_Any_data *)&local_1868,(_Any_data *)&local_1868,__destroy_functor);
  }
  if (local_1848.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1848.super__Function_base._M_manager)
              ((_Any_data *)&local_1848,(_Any_data *)&local_1848,__destroy_functor);
  }
  diy::mpi::communicator::~communicator(&local_16e0);
  assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
  assigner.super_StaticAssigner.super_Assigner.nblocks_ = nblocks;
  assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
       (_func_int **)&PTR__Assigner_0014e4b0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar11 = nblocks / world.size_;
  iVar20 = nblocks % world.size_;
  iVar26 = iVar11 + 1;
  if (world.rank_ < iVar20) {
    iVar19 = iVar26 * world.rank_;
  }
  else {
    iVar19 = (world.rank_ - iVar20) * iVar11 + iVar20 * iVar26;
  }
  iVar27 = world.rank_ + 1;
  if (iVar27 < iVar20) {
    iVar26 = iVar26 * iVar27;
  }
  else {
    iVar26 = (iVar27 - iVar20) * iVar11 + iVar20 * iVar26;
  }
  sz = CONCAT44(sz._4_4_,iVar19);
  if (iVar19 < iVar26) {
    do {
      if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&gids,
                   (iterator)
                   gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&sz);
      }
      else {
        *gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar19;
        gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish + 1;
      }
      iVar19 = (int)sz + 1;
      sz = CONCAT44(sz._4_4_,iVar19);
    } while (iVar19 < iVar26);
  }
  if (infile._M_string_length == 0) {
    tVar14 = time((time_t *)0x0);
    srand((uint)tVar14);
    if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        != gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start) {
      uVar25 = 0;
      uVar22 = 1;
      do {
        iVar11 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[uVar25];
        this = (Block<float> *)operator_new(0x40);
        (this->samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this->samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (this->samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        this->bins = 0;
        pLVar16 = (Link *)operator_new(0x20);
        (pLVar16->super_Factory<diy::Link>)._vptr_Factory =
             (_func_int **)&PTR_id_abi_cxx11__0014e530;
        (pLVar16->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pLVar16->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pLVar16->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Block<float>::generate_values(this,num_values,min,max);
        diy::Master::add(&master,iVar11,this,pLVar16);
        bVar9 = uVar22 < (ulong)((long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 2);
        uVar25 = uVar22;
        uVar22 = (ulong)((int)uVar22 + 1);
      } while (bVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Blocks generated",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
LAB_00109425:
    diy::sort<Block<float>,float,std::less<float>>
              (&master,(Assigner *)&assigner,8,0x20,(long)num_samples,(less<float> *)&sz,k,false);
    if ((print != false) || (verify == true)) {
      reader.f_ = (file *)0x0;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>
                    ::_M_invoke;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)std::
                           _Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>
                           ::_M_manager;
      uStack_1a80 = (code *)0x0;
      sz = (MPI_Offset)(uint)nblocks;
      local_1a78._8_8_ =
           std::
           _Function_handler<void_(Block<float>_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/sample-sort.cpp:181:20)>
           ::_M_invoke;
      local_1a78._0_8_ =
           std::
           _Function_handler<void_(Block<float>_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/sample-sort.cpp:181:20)>
           ::_M_manager;
      diy::Master::foreach_<Block<float>>(&master,(Callback<Block<float>_> *)&sz,(Skip *)&reader);
      if ((code *)local_1a78._0_8_ != (code *)0x0) {
        (*(code *)local_1a78._0_8_)(&sz,&sz,3);
      }
      if (reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        (*(code *)reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish)(&reader,&reader,3);
      }
    }
    if ((print & 1U) != 0) {
      sz = 0;
      format_str_00.size_ = 0x10;
      format_str_00.data_ = "Printing blocks\n";
      auVar6._8_8_ = 0;
      auVar6._0_8_ = &sz;
      fmt::v7::vprint(_stdout,format_str_00,(format_args)(auVar6 << 0x40));
      reader.f_ = (file *)0x0;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>
                    ::_M_invoke;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)std::
                           _Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>
                           ::_M_manager;
      uStack_1a80 = (code *)0x0;
      sz = (MPI_Offset)verbose;
      local_1a78._8_8_ =
           std::
           _Function_handler<void_(Block<float>_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/sample-sort.cpp:186:20)>
           ::_M_invoke;
      local_1a78._0_8_ =
           std::
           _Function_handler<void_(Block<float>_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/sample-sort.cpp:186:20)>
           ::_M_manager;
      diy::Master::foreach_<Block<float>>(&master,(Callback<Block<float>_> *)&sz,(Skip *)&reader);
      if ((code *)local_1a78._0_8_ != (code *)0x0) {
        (*(code *)local_1a78._0_8_)(&sz,&sz,3);
      }
      if (reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        (*(code *)reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish)(&reader,&reader,3);
      }
    }
    if (verify == true) {
      sz = 0;
      format_str_01.size_ = 0x11;
      format_str_01.data_ = "Verifying blocks\n";
      auVar7._8_8_ = 0;
      auVar7._0_8_ = &sz;
      fmt::v7::vprint(_stdout,format_str_01,(format_args)(auVar7 << 0x40));
      reader.f_ = (file *)Block<float>::verify_block;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      sz = 0;
      uStack_1a80 = 0;
      local_1a78._8_8_ =
           std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
           _M_invoke;
      local_1a78._0_8_ =
           std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
           _M_manager;
      diy::Master::foreach<void(Block<float>::*)(diy::Master::ProxyWithLink_const&)>
                (&master,(offset_in_Block<float>_to_subr *)&reader,(Skip *)&sz);
      if ((code *)local_1a78._0_8_ != (code *)0x0) {
        (*(code *)local_1a78._0_8_)(&sz,&sz,3);
      }
      local_16c8._M_unused._M_object = (void *)0x0;
      local_16c8._8_8_ = 0;
      local_16b0 = std::
                   _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                   ::_M_invoke;
      local_16b8 = std::
                   _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                   ::_M_manager;
      local_16a8._M_unused._M_object = (void *)0x0;
      local_16a8._8_8_ = 0;
      local_1690 = std::
                   _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                   ::_M_invoke;
      local_1698 = std::
                   _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                   ::_M_manager;
      local_1688._M_unused._M_object = (void *)0x0;
      local_1688._8_8_ = 0;
      local_1670 = std::
                   _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                   ::_M_invoke;
      local_1678 = std::
                   _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                   ::_M_manager;
      diy::Master::exchange(&master,false,(MemoryManagement *)&local_16c8);
      if (local_1678 != (code *)0x0) {
        (*local_1678)(&local_1688,&local_1688,__destroy_functor);
      }
      if (local_1698 != (code *)0x0) {
        (*local_1698)(&local_16a8,&local_16a8,__destroy_functor);
      }
      if (local_16b8 != (code *)0x0) {
        (*local_16b8)(&local_16c8,&local_16c8,__destroy_functor);
      }
      uVar25 = (ulong)((long)master.blocks_.elements_.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)master.blocks_.elements_.
                            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3;
      uVar10 = (uint)uVar25;
      if ((int)uVar10 < 1) {
        lVar24 = 0;
      }
      else {
        uVar22 = 0;
        do {
          uVar23 = uVar22;
          if (master.blocks_.elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar22] != (void *)0x0) break;
          uVar22 = uVar22 + 1;
          uVar23 = uVar25;
        } while ((uVar10 & 0x7fffffff) != uVar22);
        lVar24 = (long)(int)uVar23;
      }
      diy::Master::Proxy::Proxy
                ((Proxy *)&reader,&master,
                 master.gids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar24],(IExchangeInfo *)0x0);
      local_1a60 = (_Base_ptr)
                   reader.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      pvVar15 = master.blocks_.elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start[lVar24];
      pLVar16 = master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar24];
      local_1a58 = local_1a68;
      sz = (MPI_Offset)reader.f_;
      uStack_1a80 = reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_1a78._0_8_ =
           reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (reader.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish == (pointer)0x0) {
        local_1a68[0] = (type)0x0;
        psVar29 = &local_1a48;
        local_1a50 = local_1a58;
      }
      else {
        reader.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish[1] = (unsigned_long)local_1a58;
        psVar29 = local_1938;
        local_1a48 = local_1938[0];
        reader.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a58 = (type *)reader.stride_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1a50 = (type *)reader.offset_;
        local_1a68[0] =
             reader.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start._0_4_;
        reader.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&reader.stride_;
        reader.offset_ = (size_t)&reader.stride_;
      }
      p_Var28 = (_Rb_tree_node_base *)&local_1a38;
      *psVar29 = 0;
      if (local_1928._M_parent == (_Base_ptr)0x0) {
        psVar29 = &local_1a18;
        local_1a30 = (_Base_ptr)0x0;
        _Var21 = _S_red;
        local_1a20 = p_Var28;
      }
      else {
        local_1a30 = local_1928._M_parent;
        (local_1928._M_parent)->_M_parent = p_Var28;
        psVar29 = &local_1908;
        local_1a18 = local_1908;
        local_1928._M_parent = (_Base_ptr)0x0;
        p_Var28 = local_1928._M_left;
        local_1a20 = local_1928._M_right;
        _Var21 = local_1928._M_color;
        local_1928._M_left = &local_1928;
        local_1928._M_right = &local_1928;
      }
      *psVar29 = 0;
      local_1a38 = (int *)CONCAT44(local_1a38._4_4_,_Var21);
      local_1a10 = local_1900;
      pvStack_1a08 = pvStack_18f8;
      local_1a00 = local_18f0;
      local_1a28 = p_Var28;
      local_19f8 = pvVar15;
      local_19f0 = pLVar16;
      diy::Master::Proxy::~Proxy((Proxy *)&reader);
      p_Var12 = (local_1a10->
                super__List_base<diy::Master::Collective,_std::allocator<diy::Master::Collective>_>)
                ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
      (**(code **)((long)p_Var12->_M_next + 0x20))(p_Var12,&reader);
      std::__cxx11::list<diy::Master::Collective,_std::allocator<diy::Master::Collective>_>::
      _M_erase(local_1a10,
               (local_1a10->
               super__List_base<diy::Master::Collective,_std::allocator<diy::Master::Collective>_>).
               _M_impl._M_node.super__List_node_base._M_next);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total values: ",0xe)
      ;
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17," vs ",4);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      if (world.rank_ == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Blocks verified",0xf);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
        std::ostream::put('\x18');
        std::ostream::flush();
      }
      diy::Master::Proxy::~Proxy((Proxy *)&sz);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,world.rank_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"] Storage count:    ",0x14);
    iVar11 = diy::FileStorage::count(&storage);
    plVar18 = (long *)std::ostream::operator<<((ostream *)poVar17,iVar11);
    std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
    std::ostream::put((char)plVar18);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,world.rank_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"] Storage max size: ",0x14);
    diy::FileStorage::max_size(&storage);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    iVar11 = 0;
    std::ostream::flush();
  }
  else if (nblocks % world.size_ == 0) {
    diy::mpi::io::file::file(&in,&world,&infile,2);
    MPI_File_get_size(in.fh.data,&sz);
    uVar25 = (ulong)sz >> 2;
    if (uVar25 % (ulong)((long)nblocks * (long)chunk_size) == 0) {
      shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      sz = CONCAT44(sz._4_4_,(int)(uVar25 / (ulong)(long)chunk_size));
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&shape,(iterator)0x0,(int *)&sz);
      diy::io::BOV::BOV<std::vector<int,std::allocator<int>>>(&reader,&in,&shape,0);
      iVar11 = (int)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff) /
                    (long)nblocks);
      if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_19e0 = (char **)(long)iVar11;
        uVar25 = 0;
        uVar22 = 1;
        do {
          iVar20 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar25];
          pvVar15 = operator_new(0x40);
          *(undefined8 *)((long)pvVar15 + 0x28) = 0;
          *(undefined8 *)((long)pvVar15 + 0x30) = 0;
          *(undefined8 *)((long)pvVar15 + 0x18) = 0;
          *(undefined8 *)((long)pvVar15 + 0x20) = 0;
          *(undefined8 *)((long)pvVar15 + 8) = 0;
          *(undefined8 *)((long)pvVar15 + 0x10) = 0;
          *(int *)((long)pvVar15 + 0x38) = num_samples;
          pLVar16 = (Link *)operator_new(0x20);
          (pLVar16->super_Factory<diy::Link>)._vptr_Factory =
               (_func_int **)&PTR_id_abi_cxx11__0014e530;
          (pLVar16->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pLVar16->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pLVar16->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)((long)pvVar15 + 8),
                     (size_type)local_19e0);
          diy::Bounds<int>::Bounds((Bounds<int> *)&sz,1);
          *(int *)uStack_1a80 = (iVar11 / chunk_size) * iVar20;
          *local_1a40 = (iVar11 / chunk_size) * (iVar20 + 1) + -1;
          local_18e8._M_dataplus._M_p = &ompi_mpi_float;
          diy::mpi::io::file::read_bov
                    (reader.f_,(Bounds<int> *)&sz,
                     (int)((ulong)((long)reader.shape_.super__Vector_base<int,_std::allocator<int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)reader.shape_.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2),
                     reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (char *)(((vector<float,_std::allocator<float>_> *)((long)pvVar15 + 8))->
                             super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start,reader.offset_,(datatype *)&local_18e8
                     ,true,chunk_size);
          diy::Master::add(&master,iVar20,pvVar15,pLVar16);
          local_1a38 = local_1a40;
          if (local_1a10 !=
              (list<diy::Master::Collective,_std::allocator<diy::Master::Collective>_> *)0x0) {
            operator_delete(local_1a10,local_1a18 << 2);
          }
          local_1a78._0_8_ = uStack_1a80;
          if (local_1a50 != (type *)0x0) {
            operator_delete(local_1a50,(long)local_1a58 << 2);
          }
          bVar9 = uVar22 < (ulong)((long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                   (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start >> 2);
          uVar25 = uVar22;
          uVar22 = (ulong)((int)uVar22 + 1);
        } while (bVar9);
      }
      if (world.rank_ == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Array loaded",0xc)
        ;
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      diy::io::BOV::~BOV(&reader);
      if (shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      diy::mpi::io::file::~file(&in);
      goto LAB_00109425;
    }
    if (world.rank_ == 0) {
      fmt::v7::print<char[70],,char>
                (_stderr,(char (*) [70])
                         "Expected data size to align with the number of blocks and chunk size\n");
    }
    diy::mpi::io::file::~file(&in);
    iVar11 = 1;
  }
  else {
    iVar11 = 1;
    if (world.rank_ == 0) {
      sz = 0;
      format_str.size_ = 0x56;
      format_str.data_ =
           "Number of blocks must be divisible by the number of processes (for collective MPI-IO)\n"
      ;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = &sz;
      fmt::v7::vprint(_stderr,format_str,(format_args)(auVar5 << 0x40));
    }
  }
  if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  diy::Master::~Master(&master);
  diy::FileStorage::~FileStorage(&storage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)infile._M_dataplus._M_p != &infile.field_2) {
    operator_delete(infile._M_dataplus._M_p,
                    CONCAT71(infile.field_2._M_allocated_capacity._1_7_,
                             infile.field_2._M_local_buf[0]) + 1);
  }
LAB_00109e9f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p,prefix.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::
  _List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ::_M_clear(&ops.options.
              super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ops);
  diy::mpi::communicator::~communicator(&world);
  MPI_Finalize();
  return iVar11;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  using namespace opts;
  Options ops;

  int               nblocks     = world.size();
  size_t            num_values  = 100;
  int               k           = 2;
  int               num_samples = 8;
  int               mem_blocks  = -1;
  int               threads     = 1;
  int               chunk_size  = 1;
  std::string       prefix      = "./DIY.XXXXXX";

  bool print, verbose, verify, help;
  ops
      >> Option(     "print",   print,      "print the result")
      >> Option('v', "verbose", verbose,    "verbose output")
      >> Option(     "verify",  verify,     "verify the result")
      >> Option('h', "help",    help,       "show help")
  ;

  Value             min = 0,
                    max = 1 << 20;

  ops
      >> Option('n', "number",  num_values,     "number of values per block")
      >> Option('k', "k",       k,              "use k-ary swap")
      >> Option('s', "samples", num_samples,    "number of samples per block")
      >> Option('b', "blocks",  nblocks,        "number of blocks")
      >> Option('t', "thread",  threads,        "number of threads")
      >> Option('m', "memory",  mem_blocks,     "number of blocks to keep in memory")
      >> Option('c', "chunk",   chunk_size,     "size of a chunk in which to read the data")
      >> Option(     "prefix",  prefix,         "prefix for external storage")
  ;

  ops
      >> Option(     "min",     min,            "range min")
      >> Option(     "max",     max,            "range max")
  ;

  if (!ops.parse(argc,argv) || help)
  {
      if (world.rank() == 0)
      {
          std::cout << "Usage: " << argv[0] << " [OPTIONS] [INPUT.bov]\n";
          std::cout << "Generates random values in range [min,max] if not INPUT.bov is given.\n";
          std::cout << ops;
      }
      return 1;
  }

  std::string infile;
  ops >> PosOption(infile);

  diy::FileStorage          storage(prefix);
  diy::Master               master(world,
                                   threads,
                                   mem_blocks,
                                   &ValueBlock::create,
                                   &ValueBlock::destroy,
                                   &storage,
                                   &ValueBlock::save,
                                   &ValueBlock::load);

  diy::ContiguousAssigner   assigner(world.size(), nblocks);
  //diy::RoundRobinAssigner   assigner(world.size(), nblocks);

  std::vector<int> gids;
  assigner.local_gids(world.rank(), gids);

  if (infile.empty())
  {
    srand(static_cast<unsigned int>(time(0)));

    for (unsigned i = 0; i < gids.size(); ++i)
    {
      int             gid = gids[i];
      ValueBlock*     b   = new ValueBlock(0);      // bins not used in sample-sort
      Link*           l   = new Link;

      // this could be replaced by reading values from a file
      b->generate_values(num_values, min, max);

      master.add(gid, b, l);
    }
    std::cout << "Blocks generated" << std::endl;
  } else
  {
    if (nblocks % world.size() != 0)
    {
      if (world.rank() == 0)
          fmt::print(stderr, "Number of blocks must be divisible by the number of processes (for collective MPI-IO)\n");
      return 1;
    }

    // determine the size of the file, divide by sizeof(Value)
    diy::mpi::io::file in(world, infile, diy::mpi::io::file::rdonly);
    size_t sz = in.size() / sizeof(Value);

    // We have to work around a weirdness in MPI-IO. MPI expresses various
    // sizes as integers, which is too small to reference large data. So
    // instead we create a FileBlock of larger size and read in terms of those
    // blocks.
    if (sz % (chunk_size * nblocks) != 0)
    {
      if (world.rank() == 0)
          fmt::print(stderr, "Expected data size to align with the number of blocks and chunk size\n");
      return 1;
    }

    std::vector<int> shape;
    shape.push_back(static_cast<int>(sz / chunk_size));
    diy::io::BOV reader(in, shape);

    int block_size = static_cast<int>(sz) / nblocks;

    for (unsigned i = 0; i < gids.size(); ++i)
    {
      int             gid = gids[i];
      ValueBlock*     b   = new ValueBlock(num_samples);
      Link*           l   = new Link;

      // read values from a file
      b->values.resize(static_cast<size_t>(block_size));
      diy::DiscreteBounds block_bounds(1);
      block_bounds.min[0] =  gid      * (block_size / chunk_size);
      block_bounds.max[0] = (gid + 1) * (block_size / chunk_size) - 1;

      reader.read(block_bounds, &b->values[0], true, chunk_size);

      master.add(gid, b, l);
    }

    if (world.rank() == 0)
      std::cout << "Array loaded" << std::endl;
  }

  diy::sort(master, assigner,
            &ValueBlock::values,
            &ValueBlock::samples,
            num_samples,
            k);

  if (print || verify)
    master.foreach([nblocks](ValueBlock* b, const diy::Master::ProxyWithLink& cp) { set_min_max(b, cp, nblocks); });

  if (print)
  {
    fmt::print("Printing blocks\n");
    master.foreach([verbose](ValueBlock* b, const diy::Master::ProxyWithLink& cp) { b->print_block(cp, verbose); });
  }
  if (verify)
  {
    fmt::print("Verifying blocks\n");
    master.foreach(&ValueBlock::verify_block);

    master.exchange();      // to process collectives
    typedef diy::Master::ProxyWithLink      Proxy;
    int     idx   = master.loaded_block();
    Proxy   proxy = master.proxy(idx);
    size_t  total = proxy.get<size_t>();
    std::cout << "Total values: " << total << " vs " << nblocks * num_values << std::endl;

    if (world.rank() == 0)
      std::cout << "Blocks verified" << std::endl;
  }

  std::cout << "[" << world.rank() << "] Storage count:    " << storage.count() << std::endl;
  std::cout << "[" << world.rank() << "] Storage max size: " << storage.max_size() << std::endl;
}